

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

UniquePtr<EC_KEY> __thiscall
anon_unknown.dwarf_5c29f0::DecodeECPrivateKey
          (anon_unknown_dwarf_5c29f0 *this,uint8_t *in,size_t in_len)

{
  UniquePtr<EC_KEY> ret;
  CBS cbs;
  _Head_base<0UL,_ec_key_st_*,_false> local_20;
  CBS local_18;
  
  local_18.data = in;
  local_18.len = in_len;
  local_20._M_head_impl = EC_KEY_parse_private_key(&local_18,(EC_GROUP *)0x0);
  if ((local_20._M_head_impl == (EC_KEY *)0x0) || (local_18.len != 0)) {
    *(undefined8 *)this = 0;
  }
  else {
    *(ec_key_st **)this = local_20._M_head_impl;
    local_20._M_head_impl = (EC_KEY *)0x0;
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_20);
  return (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<EC_KEY> DecodeECPrivateKey(const uint8_t *in,
                                                  size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  bssl::UniquePtr<EC_KEY> ret(EC_KEY_parse_private_key(&cbs, NULL));
  if (!ret || CBS_len(&cbs) != 0) {
    return nullptr;
  }
  return ret;
}